

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O0

vector<short,_std::allocator<short>_> * get_primes<short,short>(short max)

{
  vector<char,_std::allocator<char>_> *this;
  reference pvVar1;
  short in_SI;
  allocator_type *in_RDI;
  size_t i_1;
  size_t j;
  size_t i;
  vector<char,_std::allocator<char>_> sieve;
  size_t n;
  vector<short,_std::allocator<short>_> *primes;
  value_type_conflict2 *in_stack_ffffffffffffff68;
  allocator_type *__a;
  allocator<char> *__n;
  undefined6 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff96;
  size_type local_68;
  size_type local_58;
  size_type local_50;
  allocator<char> local_32;
  undefined1 local_31;
  vector<char,_std::allocator<char>_> local_30;
  ulong local_18;
  
  local_18 = (ulong)in_SI;
  this = (vector<char,_std::allocator<char>_> *)(local_18 + 1);
  local_31 = 1;
  __n = &local_32;
  __a = in_RDI;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT26(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90),(size_type)__n,
             (value_type *)this,__a);
  std::allocator<char>::~allocator(&local_32);
  for (local_50 = 2; local_50 * local_50 < local_18 || local_50 * local_50 - local_18 == 0;
      local_50 = local_50 + 1) {
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[](&local_30,local_50);
    if (*pvVar1 != '\0') {
      for (local_58 = local_50 * local_50; local_58 <= local_18; local_58 = local_50 + local_58) {
        pvVar1 = std::vector<char,_std::allocator<char>_>::operator[](&local_30,local_58);
        *pvVar1 = '\0';
      }
    }
  }
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x10918c);
  for (local_68 = 2; local_68 <= local_18; local_68 = local_68 + 1) {
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[](&local_30,local_68);
    if (*pvVar1 != '\0') {
      std::vector<short,_std::allocator<short>_>::push_back
                ((vector<short,_std::allocator<short>_> *)in_RDI,in_stack_ffffffffffffff68);
    }
  }
  std::vector<char,_std::allocator<char>_>::~vector(this);
  return (vector<short,_std::allocator<short>_> *)__a;
}

Assistant:

std::vector<divider_type> get_primes(T max) {
    size_t n = (size_t)max;
    std::vector<char> sieve(n + 1, true);

    for (size_t i = 2; i * i <= n; i++)
        if (sieve[i])
            for (size_t j = i * i; j <= n; j += i) sieve[j] = false;

    std::vector<divider_type> primes;
    for (size_t i = 2; i <= n; i++)
        if (sieve[i]) primes.push_back((T)i);

    return primes;
}